

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

stbfile * stb_open(char *filename,char *mode)

{
  FILE *f_00;
  int iVar1;
  char *local_40;
  stbfile *s;
  FILE *f;
  char *mode_local;
  char *filename_local;
  
  local_40 = mode;
  if (*mode == 'k') {
    local_40 = mode + 1;
  }
  f_00 = stb_fopen(filename,local_40);
  if (f_00 == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)stb_openf(f_00);
    if ((stbfile *)filename_local != (stbfile *)0x0) {
      ((stbfile *)filename_local)->close = stb__fclose2;
      iVar1 = 1;
      if (*mode == 'k') {
        iVar1 = 2;
      }
      (((stbfile *)filename_local)->field_12).various = iVar1;
    }
  }
  return (stbfile *)filename_local;
}

Assistant:

stbfile *stb_open(char *filename, char *mode)
{
   FILE *f = stb_fopen(filename, mode[0] == 'k' ? mode+1 : mode);
   stbfile *s;
   if (f == NULL) return NULL;
   s = stb_openf(f);
   if (s) {
      s->close = stb__fclose2;
      s->various = mode[0] == 'k' ? stb_keep_if_different : stb_keep_yes;
   }
   return s;
}